

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRepresentation::IfcRepresentation(IfcRepresentation *this,void **vtt)

{
  void **vtt_local;
  IfcRepresentation *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>,vtt + 1);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>)._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
                    _vptr_ObjectHelper +
            (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
                  _vptr_ObjectHelper[-3]) = vtt[3];
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).field_0x10
             ,(LazyObject *)0x0);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).field_0x18);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->RepresentationType);
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_1UL,_0UL>::ListOf
            (&this->Items);
  return;
}

Assistant:

IfcRepresentation() : Object("IfcRepresentation") {}